

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MurmurHash2.cpp
# Opt level: O0

uint32_t MurmurHashAligned2(void *key,int len,uint32_t seed)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  byte *pbVar6;
  sbyte sVar7;
  uint32_t k_2;
  uint32_t k_1;
  uint32_t k;
  int sr;
  int sl;
  uint32_t d;
  uint32_t t;
  int align;
  uint32_t h;
  uchar *data;
  int r;
  uint32_t m;
  uint32_t seed_local;
  int len_local;
  void *key_local;
  byte bVar8;
  
  h = seed ^ len;
  uVar2 = (uint)key & 3;
  data = (uchar *)key;
  len_local = len;
  if ((((ulong)key & 3) == 0) || (len < 4)) {
    for (; 3 < len_local; len_local = len_local + -4) {
      h = ((uint)(*(int *)data * 0x5bd1e995) >> 0x18 ^ *(int *)data * 0x5bd1e995) * 0x5bd1e995 ^
          h * 0x5bd1e995;
      data = data + 4;
    }
    if (len_local != 1) {
      if (len_local != 2) {
        if (len_local != 3) goto LAB_001b8b80;
        h = (uint)data[2] << 0x10 ^ h;
      }
      h = (uint)data[1] << 8 ^ h;
    }
    h = (*data ^ h) * 0x5bd1e995;
LAB_001b8b80:
    uVar2 = (h >> 0xd ^ h) * 0x5bd1e995;
    return uVar2 >> 0xf ^ uVar2;
  }
  t = 0;
  if (uVar2 == 1) {
    t = (uint)*(byte *)((long)key + 2) << 0x10;
LAB_001b875f:
    t = (uint)*(byte *)((long)key + 1) << 8 | t;
LAB_001b8773:
    t = *key | t;
  }
  else {
    if (uVar2 == 2) goto LAB_001b875f;
    if (uVar2 == 3) goto LAB_001b8773;
  }
  data = (uchar *)((long)key + (long)(int)(4 - uVar2));
  len_local = len - (4 - uVar2);
  uVar3 = (4 - uVar2) * 8;
  t = t << (sbyte)(uVar2 << 3);
  while( true ) {
    sVar7 = (sbyte)(uVar2 << 3);
    bVar8 = (byte)uVar3;
    if (len_local < 4) break;
    uVar1 = *(uint32_t *)data;
    uVar4 = (t >> sVar7 | uVar1 << (bVar8 & 0x1f)) * 0x5bd1e995;
    h = (uVar4 >> 0x18 ^ uVar4) * 0x5bd1e995 ^ h * 0x5bd1e995;
    data = data + 4;
    len_local = len_local + -4;
    t = uVar1;
  }
  d = 0;
  if (len_local < (int)uVar2) {
    switch(len_local) {
    case 3:
      d = (uint)data[2] << 0x10;
    case 2:
      d = (uint)data[1] << 8 | d;
    case 1:
      d = *data | d;
    case 0:
      h = ((t >> sVar7 | d << (bVar8 & 0x1f)) ^ h) * 0x5bd1e995;
    }
    goto switchD_001b8a0a_default;
  }
  if (uVar2 == 1) {
LAB_001b88dd:
    d = *data | d;
  }
  else {
    if (uVar2 == 2) {
LAB_001b88c9:
      d = (uint)data[1] << 8 | d;
      goto LAB_001b88dd;
    }
    if (uVar2 == 3) {
      d = (uint)data[2] << 0x10;
      goto LAB_001b88c9;
    }
  }
  uVar3 = (t >> (uVar2 << 3) | d << (uVar3 & 0x1f)) * 0x5bd1e995;
  h = h * 0x5bd1e995 ^ (uVar3 ^ uVar3 >> 0x18) * 0x5bd1e995;
  pbVar6 = data + (int)uVar2;
  iVar5 = len_local - uVar2;
  if (iVar5 != 1) {
    if (iVar5 != 2) {
      if (iVar5 != 3) goto switchD_001b8a0a_default;
      h = (uint)pbVar6[2] << 0x10 ^ h;
    }
    h = (uint)pbVar6[1] << 8 ^ h;
  }
  h = (*pbVar6 ^ h) * 0x5bd1e995;
switchD_001b8a0a_default:
  uVar2 = (h >> 0xd ^ h) * 0x5bd1e995;
  return uVar2 >> 0xf ^ uVar2;
}

Assistant:

uint32_t MurmurHashAligned2 ( const void * key, int len, uint32_t seed )
{
  const uint32_t m = 0x5bd1e995;
  const int r = 24;

  const unsigned char * data = (const unsigned char *)key;

  uint32_t h = seed ^ len;

  int align = (uint64_t)data & 3;

  if(align && (len >= 4))
  {
    // Pre-load the temp registers

    uint32_t t = 0, d = 0;

    switch(align)
    {
      case 1: t |= data[2] << 16;
      case 2: t |= data[1] << 8;
      case 3: t |= data[0];
    }

    t <<= (8 * align);

    data += 4-align;
    len -= 4-align;

    int sl = 8 * (4-align);
    int sr = 8 * align;

    // Mix

    while(len >= 4)
    {
      d = *(uint32_t *)data;
      t = (t >> sr) | (d << sl);

      uint32_t k = t;

      MIX(h,k,m);

      t = d;

      data += 4;
      len -= 4;
    }

    // Handle leftover data in temp registers

    d = 0;

    if(len >= align)
    {
      switch(align)
      {
      case 3: d |= data[2] << 16;
      case 2: d |= data[1] << 8;
      case 1: d |= data[0];
      }

      uint32_t k = (t >> sr) | (d << sl);
      MIX(h,k,m);

      data += align;
      len -= align;

      //----------
      // Handle tail bytes

      switch(len)
      {
      case 3: h ^= data[2] << 16;
      case 2: h ^= data[1] << 8;
      case 1: h ^= data[0];
          h *= m;
      };
    }
    else
    {
      switch(len)
      {
      case 3: d |= data[2] << 16;
      case 2: d |= data[1] << 8;
      case 1: d |= data[0];
      case 0: h ^= (t >> sr) | (d << sl);
          h *= m;
      }
    }

    h ^= h >> 13;
    h *= m;
    h ^= h >> 15;

    return h;
  }
  else
  {
    while(len >= 4)
    {
      uint32_t k = *(uint32_t *)data;

      MIX(h,k,m);

      data += 4;
      len -= 4;
    }

    //----------
    // Handle tail bytes

    switch(len)
    {
    case 3: h ^= data[2] << 16;
    case 2: h ^= data[1] << 8;
    case 1: h ^= data[0];
        h *= m;
    };

    h ^= h >> 13;
    h *= m;
    h ^= h >> 15;

    return h;
  }
}